

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall Catch::XmlReporter::benchmarkPreparing(XmlReporter *this,StringRef name)

{
  StringRef name_00;
  allocator<char> local_41;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"BenchmarkResults",&local_41);
  XmlWriter::startElement(&this->m_xml,&local_40,Newline|Indent);
  name_00.m_size = 4;
  name_00.m_start = "name";
  XmlWriter::writeAttribute(&this->m_xml,name_00,name);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void XmlReporter::benchmarkPreparing( StringRef name ) {
        m_xml.startElement("BenchmarkResults")
             .writeAttribute("name"_sr, name);
    }